

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O2

double __thiscall CholeskyFactor::density(CholeskyFactor *this)

{
  uint uVar1;
  pointer pdVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  HighsInt j;
  ulong uVar6;
  
  uVar1 = this->current_k;
  if ((ulong)uVar1 != 0) {
    pdVar2 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = 0;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    iVar5 = 0;
    for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
      for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
        iVar5 = iVar5 + (uint)(1e-07 < ABS(pdVar2[uVar6]));
      }
      pdVar2 = pdVar2 + this->current_k_max;
    }
    return (double)iVar5 / ((double)(int)((uVar1 + 1) * uVar1) * 0.5);
  }
  return 0.0;
}

Assistant:

double density() {
    if (current_k == 0) {
      return 0.0;
    }

    HighsInt num_nz = 0;
    for (HighsInt i = 0; i < current_k; i++) {
      for (HighsInt j = 0; j < current_k; j++) {
        if (fabs(L[i * current_k_max + j]) > 1e-7) {
          num_nz++;
        }
      }
    }
    return (double)num_nz / (current_k * (current_k + 1) / 2.0);
  }